

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_variable.cpp
# Opt level: O0

DFsVariable * __thiscall DFsScript::VariableForName(DFsScript *this,char *name)

{
  int iVar1;
  char *__s2;
  DFsVariable *local_30;
  DFsVariable *current;
  int n;
  char *name_local;
  DFsScript *this_local;
  
  iVar1 = variable_hash(name);
  local_30 = ::TObjPtr::operator_cast_to_DFsVariable_((TObjPtr *)(this->variables + iVar1));
  while( true ) {
    if (local_30 == (DFsVariable *)0x0) {
      return (DFsVariable *)0x0;
    }
    __s2 = FString::operator_cast_to_char_(&local_30->Name);
    iVar1 = strcmp(name,__s2);
    if (iVar1 == 0) break;
    local_30 = ::TObjPtr::operator_cast_to_DFsVariable_((TObjPtr *)&local_30->next);
  }
  return local_30;
}

Assistant:

DFsVariable *DFsScript::VariableForName(const char *name)
{
	int n = variable_hash(name);
	DFsVariable *current = variables[n];
	
	while(current)
    {
		if(!strcmp(name, current->Name))        // found it?
			return current;         
		current = current->next;        // check next in chain
    }
	
	return NULL;
}